

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O1

Frame * __thiscall rw::Frame::cloneAndLink(Frame *this)

{
  uint8 *puVar1;
  Frame *this_00;
  
  this_00 = cloneRecurse(this,(Frame *)0x0);
  if (this_00 != (Frame *)0x0) {
    puVar1 = &(this_00->object).privateFlags;
    *puVar1 = *puVar1 & 0xfc;
    updateObjects(this_00);
  }
  return this_00;
}

Assistant:

Frame*
Frame::cloneAndLink(void)
{
	Frame *newhier = cloneRecurse(this, nil);
	if(newhier){
		// frame is not in dirty list so important to get this flag right
		newhier->object.privateFlags &= ~HIERARCHYSYNC;
		newhier->updateObjects();
	}
	return newhier;
}